

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O2

void __thiscall mocker::Annotator::operator()(Annotator *this,ReturnStmt *node)

{
  bool bVar1;
  mapped_type *rhs;
  CompileError *this_00;
  mapped_type *pmVar2;
  shared_ptr<mocker::ast::Expression> *__r;
  pointer_____offset_0x10___ *ppuVar3;
  ReturnStmt *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_30 = node;
  if (this->inFunc == false) {
    this_00 = (CompileError *)__cxa_allocate_exception(0x48);
    pmVar2 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this->pos,(key_type *)&local_30);
    CompileError::CompileError(this_00,pmVar2->first,pmVar2->second);
    *(undefined ***)this_00 = &PTR__CompileError_001f3ae0;
    ppuVar3 = &ReturnOutOfAFunction::typeinfo;
  }
  else {
    if ((node->expr).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      if ((this->retType).super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        return;
      }
      this_00 = (CompileError *)__cxa_allocate_exception(0x48);
      pmVar2 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this->pos,(key_type *)&local_30);
      CompileError::CompileError(this_00,pmVar2->first,pmVar2->second);
    }
    else {
      __r = &node->expr;
      std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ast::Expression,void>
                ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_30,
                 &__r->super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>);
      visit(this,(shared_ptr<mocker::ast::ASTNode> *)&local_30);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
      local_30 = (ReturnStmt *)
                 (__r->super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      rhs = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->ctx->exprType,(key_type *)&local_30);
      bVar1 = assignable(this,&this->retType,rhs);
      if (bVar1) {
        return;
      }
      this_00 = (CompileError *)__cxa_allocate_exception(0x48);
      local_30 = (ReturnStmt *)
                 (__r->super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      pmVar2 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this->pos,(key_type *)&local_30);
      CompileError::CompileError(this_00,pmVar2->first,pmVar2->second);
    }
    *(undefined ***)this_00 = &PTR__CompileError_001f39f8;
    ppuVar3 = &IncompatibleTypes::typeinfo;
  }
  __cxa_throw(this_00,ppuVar3,CompileError::~CompileError);
}

Assistant:

void operator()(ast::ReturnStmt &node) const override {
    if (!inFunc)
      throw ReturnOutOfAFunction(pos.at(node.getID()));
    if (!node.expr) {
      if (!retType)
        return;
      throw IncompatibleTypes(pos.at(node.getID()));
    }

    visit(node.expr);
    if (!assignable(retType, ctx.exprType[node.expr->getID()]))
      throw IncompatibleTypes(pos.at(node.expr->getID()));
  }